

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_ObjAddFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFanins)

{
  uint uVar1;
  ushort uVar2;
  int *piVar3;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *__dest;
  
  if (pObj->nFanins != 0) {
    __assert_fail("pObj->nFanins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                  ,0xf1,"void Wlc_ObjAddFanins(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *)");
  }
  uVar1 = vFanins->nSize;
  pObj->nFanins = uVar1;
  uVar2 = *(ushort *)pObj & 0x3f;
  if ((uVar2 == 0x35) || (uVar2 == 0x16)) {
    pObj->nFanins = 1;
    if (uVar2 == 0x16) goto LAB_00344df4;
LAB_00344e0d:
    if ((*(uint *)pObj & 0x3f | 0x10) != 0x16) {
      __dest = &pObj->field_10;
      goto LAB_00344e24;
    }
  }
  else {
    if (uVar2 == 6) {
      pObj->nFanins = 0;
    }
    else if ((uVar1 < 3) && ((uVar2 | 0x10) != 0x16)) goto LAB_00344e0d;
LAB_00344df4:
    piVar3 = (int *)Mem_FlexEntryFetch(p->pMemFanin,uVar1 << 2);
    (pObj->field_10).pFanins[0] = piVar3;
    if (pObj->nFanins < 3) goto LAB_00344e0d;
  }
  __dest = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
LAB_00344e24:
  memcpy(__dest,vFanins->pArray,(long)vFanins->nSize << 2);
  return;
}

Assistant:

void Wlc_ObjAddFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFanins )
{
    assert( pObj->nFanins == 0 );
    pObj->nFanins = Vec_IntSize(vFanins);
    // special treatment of CONST, SELECT and TABLE
    if ( pObj->Type == WLC_OBJ_CONST )
        pObj->nFanins = 0;
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
        pObj->nFanins = 1;
    if ( Wlc_ObjHasArray(pObj) )
        pObj->pFanins[0] = (int *)Mem_FlexEntryFetch( p->pMemFanin, Vec_IntSize(vFanins) * sizeof(int) );
    memcpy( Wlc_ObjFanins(pObj), Vec_IntArray(vFanins), sizeof(int) * Vec_IntSize(vFanins) );
}